

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_insertproxymodel.cpp
# Opt level: O0

int __thiscall InsertProxyModel::qt_metacall(InsertProxyModel *this,Call _c,int _id,void **_a)

{
  void **_a_local;
  int _id_local;
  Call _c_local;
  InsertProxyModel *this_local;
  
  _a_local._0_4_ = QAbstractProxyModel::qt_metacall((Call)this,_c,(void **)(ulong)(uint)_id);
  this_local._4_4_ = (int)_a_local;
  if (-1 < (int)_a_local) {
    if (_c == InvokeMetaMethod) {
      if ((int)_a_local < 7) {
        qt_static_metacall((QObject *)this,InvokeMetaMethod,(int)_a_local,_a);
      }
      _a_local._0_4_ = (int)_a_local + -7;
    }
    else if (_c == RegisterMethodArgumentMetaType) {
      if ((int)_a_local < 7) {
        qt_static_metacall((QObject *)this,RegisterMethodArgumentMetaType,(int)_a_local,_a);
      }
      _a_local._0_4_ = (int)_a_local + -7;
    }
    else if ((((_c == ReadProperty) || (_c == WriteProperty)) || (_c == ResetProperty)) ||
            ((_c == BindableProperty || (_c == RegisterPropertyMetaType)))) {
      qt_static_metacall((QObject *)this,_c,(int)_a_local,_a);
      _a_local._0_4_ = (int)_a_local + -2;
    }
    this_local._4_4_ = (int)_a_local;
  }
  return this_local._4_4_;
}

Assistant:

int InsertProxyModel::qt_metacall(QMetaObject::Call _c, int _id, void **_a)
{
    _id = QAbstractProxyModel::qt_metacall(_c, _id, _a);
    if (_id < 0)
        return _id;
    if (_c == QMetaObject::InvokeMetaMethod) {
        if (_id < 7)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 7;
    } else if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        if (_id < 7)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 7;
    }
#ifndef QT_NO_PROPERTIES
    else if (_c == QMetaObject::ReadProperty || _c == QMetaObject::WriteProperty
            || _c == QMetaObject::ResetProperty || _c == QMetaObject::BindableProperty
            || _c == QMetaObject::RegisterPropertyMetaType) {
        qt_static_metacall(this, _c, _id, _a);
        _id -= 2;
    }
#endif // QT_NO_PROPERTIES
    return _id;
}